

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QChar * __thiscall
QUtf16::convertToUnicode
          (QUtf16 *this,QChar *out,QByteArrayView in,State *state,DataEndianness endian)

{
  byte *pbVar1;
  uint uVar2;
  byte bVar3;
  QChar QVar4;
  ushort uVar5;
  uint *puVar6;
  byte *source;
  byte bVar7;
  uint uVar8;
  long lVar9;
  
  uVar8 = (uint)state;
  puVar6 = (uint *)in.m_data;
  source = (byte *)in.m_size;
  if (uVar8 == 0) {
    uVar8 = puVar6[6];
  }
  lVar9 = *(long *)(puVar6 + 2);
  if ((long)&out->ucs + lVar9 < 2) {
    if (out == (QChar *)0x0) {
      return (QChar *)this;
    }
    puVar6[2] = 1;
    puVar6[3] = 0;
    bVar3 = *source;
    goto LAB_002ff672;
  }
  pbVar1 = source + (long)out;
  uVar2 = puVar6[1];
  bVar3 = ((byte)*puVar6 & 8) >> 3;
  if (bVar3 == 0 && (uVar2 & 1) == 0) {
    if (lVar9 != 0) goto LAB_002ff5be;
    bVar7 = *source;
    source = source + 1;
LAB_002ff5ca:
    puVar6[1] = uVar2 | 1;
    uVar5 = CONCAT11(*source,bVar7);
    if (uVar8 == 1) {
LAB_002ff5ec:
      uVar8 = 1;
      uVar5 = uVar5 << 8 | (ushort)*source;
    }
    else if (uVar8 == 0) {
      if (uVar5 == 0xfffe) goto LAB_002ff5ec;
      uVar8 = 2;
    }
    source = source + 1;
    if ((bVar3 != 0 || (uVar2 & 1) != 0) || uVar5 != 0xfeff) {
      *(ushort *)this = uVar5;
      this = this + 2;
    }
LAB_002ff612:
    out = (QChar *)(pbVar1 + -(long)source);
    lVar9 = (long)out >> 1;
    if (uVar8 != 1) goto LAB_002ff636;
    qbswap<2>(source,lVar9,this);
    uVar8 = 1;
  }
  else {
    if (lVar9 != 0) {
LAB_002ff5be:
      bVar7 = (byte)puVar6[7];
      goto LAB_002ff5ca;
    }
    if (uVar8 != 0) goto LAB_002ff612;
    lVar9 = (long)out >> 1;
    uVar8 = 2;
LAB_002ff636:
    qFromLittleEndian<char16_t>(source,lVar9,this);
  }
  this = this + lVar9 * 2;
  puVar6[6] = uVar8;
  puVar6[2] = 0;
  puVar6[3] = 0;
  if (((ulong)out & 1) == 0) {
    puVar6[7] = 0;
    return (QChar *)this;
  }
  if ((*puVar6 & 1) != 0) {
    QVar4.ucs = L'�';
    if ((*puVar6 & 2) != 0) {
      QVar4.ucs = L'\0';
    }
    *(char16_t *)this = QVar4.ucs;
    return (QChar *)(this + 2);
  }
  puVar6[2] = 1;
  puVar6[3] = 0;
  bVar3 = pbVar1[-1];
LAB_002ff672:
  puVar6[7] = (int)(char)bVar3;
  return (QChar *)this;
}

Assistant:

QChar *QUtf16::convertToUnicode(QChar *out, QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    qsizetype len = in.size();
    const char *chars = in.data();

    Q_ASSERT(state);

    if (endian == DetectEndianness)
        endian = (DataEndianness)state->state_data[Endian];

    const char *end = chars + len;

    // make sure we can decode at least one char
    if (state->remainingChars + len < 2) {
        if (len) {
            Q_ASSERT(state->remainingChars == 0 && len == 1);
            state->remainingChars = 1;
            state->state_data[Data] = *chars;
        }
        return out;
    }

    bool headerdone = state && state->internalState & HeaderDone;
    if (state->flags & QStringConverter::Flag::ConvertInitialBom)
        headerdone = true;

    if (!headerdone || state->remainingChars) {
        uchar buf;
        if (state->remainingChars)
            buf = state->state_data[Data];
        else
            buf = *chars++;

        // detect BOM, set endianness
        state->internalState |= HeaderDone;
        QChar ch(buf, *chars++);
        if (endian == DetectEndianness) {
            // someone set us up the BOM
            if (ch == QChar::ByteOrderSwapped) {
                endian = BigEndianness;
            } else if (ch == QChar::ByteOrderMark) {
                endian = LittleEndianness;
            } else {
                if (QSysInfo::ByteOrder == QSysInfo::BigEndian) {
                    endian = BigEndianness;
                } else {
                    endian = LittleEndianness;
                }
            }
        }
        if (endian == BigEndianness)
            ch = QChar::fromUcs2((ch.unicode() >> 8) | ((ch.unicode() & 0xff) << 8));
        if (headerdone || ch != QChar::ByteOrderMark)
            *out++ = ch;
    } else if (endian == DetectEndianness) {
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;
    }

    qsizetype nPairs = (end - chars) >> 1;
    if (endian == BigEndianness)
        qFromBigEndian<char16_t>(chars, nPairs, out);
    else
        qFromLittleEndian<char16_t>(chars, nPairs, out);
    out += nPairs;

    state->state_data[Endian] = endian;
    state->remainingChars = 0;
    if ((end - chars) & 1) {
        if (state->flags & QStringConverter::Flag::Stateless) {
            *out++ = state->flags & QStringConverter::Flag::ConvertInvalidToNull ? QChar::Null : QChar::ReplacementCharacter;
        } else {
            state->remainingChars = 1;
            state->state_data[Data] = *(end - 1);
        }
    } else {
        state->state_data[Data] = 0;
    }

    return out;
}